

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

void nn_req_out(nn_sockbase *self,nn_pipe *pipe)

{
  nn_sockbase *local_28;
  nn_req *req;
  nn_pipe *pipe_local;
  nn_sockbase *self_local;
  
  local_28 = self;
  if (self == (nn_sockbase *)0x0) {
    local_28 = (nn_sockbase *)0x0;
  }
  nn_xreq_out(local_28,pipe);
  if (*(int *)&local_28[0x37].sock == 3) {
    nn_fsm_action((nn_fsm *)(local_28 + 0x32),3);
  }
  return;
}

Assistant:

void nn_req_out (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_req *req;

    req = nn_cont (self, struct nn_req, xreq.sockbase);

    /*  Add the pipe to the underlying raw socket. */
    nn_xreq_out (&req->xreq.sockbase, pipe);

    /*  Notify the state machine. */
    if (req->state == NN_REQ_STATE_DELAYED)
        nn_fsm_action (&req->fsm, NN_REQ_ACTION_OUT);
}